

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O2

bool __thiscall QHttpSocketEngine::connectInternal(QHttpSocketEngine *this)

{
  long lVar1;
  long *plVar2;
  quint16 qVar3;
  int iVar4;
  SocketState SVar5;
  long lVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  *(undefined1 *)(lVar1 + 0x11e) = 0;
  iVar4 = *(int *)(lVar1 + 0x108);
  if (iVar4 == 1) {
    if (*(int *)(lVar1 + 0x98) != 3) {
      QAbstractSocketEngine::setState((QAbstractSocketEngine *)this,UnconnectedState);
      iVar4 = *(int *)(lVar1 + 0x108);
      goto LAB_0020a964;
    }
  }
  else {
    if (iVar4 == 2) {
      local_58.d._0_4_ = 2;
      local_58.size._4_4_ = 0;
      local_58._4_8_ = 0;
      local_58._12_8_ = 0;
      local_40 = "default";
      QMessageLogger::warning
                ((char *)&local_58,"QHttpSocketEngine::connectToHost: called when already connected"
                );
      QAbstractSocketEngine::setState((QAbstractSocketEngine *)this,ConnectedState);
      bVar7 = true;
      goto LAB_0020aa03;
    }
LAB_0020a964:
    if (iVar4 == 0) {
      SVar5 = QAbstractSocket::state(*(QAbstractSocket **)(lVar1 + 0xf8));
      if (SVar5 == UnconnectedState) {
        QAbstractSocketEngine::setState((QAbstractSocketEngine *)this,ConnectingState);
        (**(code **)(**(long **)(lVar1 + 0xf8) + 0x108))(*(long **)(lVar1 + 0xf8),0x10000);
        plVar2 = *(long **)(lVar1 + 0xf8);
        QNetworkProxy::hostName((QString *)&local_58,(QNetworkProxy *)(lVar1 + 0xd8));
        qVar3 = QNetworkProxy::port((QNetworkProxy *)(lVar1 + 0xd8));
        (**(code **)(*plVar2 + 0xf8))(plVar2,&local_58,qVar3,3,2);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      }
    }
  }
  lVar6 = (**(code **)(*(long *)this + 0xb0))(this);
  if (lVar6 != 0) {
    slotSocketReadNotification(this);
  }
  bVar7 = *(int *)(lVar1 + 0x98) == 3;
LAB_0020aa03:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpSocketEngine::connectInternal()
{
    Q_D(QHttpSocketEngine);

    d->credentialsSent = false;

    // If the handshake is done, enter ConnectedState state and return true.
    if (d->state == Connected) {
        qWarning("QHttpSocketEngine::connectToHost: called when already connected");
        setState(QAbstractSocket::ConnectedState);
        return true;
    }

    if (d->state == ConnectSent && d->socketState != QAbstractSocket::ConnectedState)
        setState(QAbstractSocket::UnconnectedState);

    // Handshake isn't done. If unconnected, start connecting.
    if (d->state == None && d->socket->state() == QAbstractSocket::UnconnectedState) {
        setState(QAbstractSocket::ConnectingState);
        //limit buffer in internal socket, data is buffered in the external socket under application control
        d->socket->setReadBufferSize(65536);
        d->socket->connectToHost(d->proxy.hostName(), d->proxy.port());
    }

    // If connected (might happen right away, at least for localhost services
    // on some BSD systems), there might already be bytes available.
    if (bytesAvailable())
        slotSocketReadNotification();

    return d->socketState == QAbstractSocket::ConnectedState;
}